

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseCharRange(xmlRegParserCtxtPtr ctxt)

{
  uint local_20;
  uint local_1c;
  int end;
  int start;
  int len;
  int cur;
  xmlRegParserCtxtPtr ctxt_local;
  
  _len = ctxt;
  if (*ctxt->cur == '\0') {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Expecting \']\'");
    return;
  }
  start = (int)*ctxt->cur;
  if (start == 0x5c) {
    ctxt->cur = ctxt->cur + 1;
    local_1c = (uint)*ctxt->cur;
    switch(local_1c) {
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2d:
    case 0x2e:
    case 0x3f:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x7b:
    case 0x7c:
    case 0x7d:
      break;
    default:
      ctxt->error = 0x5aa;
      start = local_1c;
      xmlRegexpErrCompile(ctxt,"Invalid escape value");
      return;
    case 0x6e:
      local_1c = 10;
      break;
    case 0x72:
      local_1c = 0xd;
      break;
    case 0x74:
      local_1c = 9;
    }
    end = 1;
  }
  else {
    if ((start == 0x5b) || (start == 0x5d)) {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"Expecting a char range");
      return;
    }
    end = 4;
    local_1c = xmlGetUTF8Char(ctxt->cur,&end);
    if ((int)local_1c < 0) {
      _len->error = 0x5aa;
      xmlRegexpErrCompile(_len,"Invalid UTF-8");
      return;
    }
  }
  if ((((local_1c == 0x2d) && (_len->cur[1] != ']')) && (_len->cur[-1] != '[')) &&
     (_len->cur[-1] != '^')) {
    _len->cur = _len->cur + end;
  }
  else {
    _len->cur = _len->cur + end;
    start = (int)*_len->cur;
    if (((start == 0x2d) && (_len->cur[1] != '[')) && (_len->cur[1] != ']')) {
      _len->cur = _len->cur + 1;
      start = (int)*_len->cur;
      if (start == 0x5c) {
        _len->cur = _len->cur + 1;
        start = (int)*_len->cur;
        switch(start) {
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x2d:
        case 0x2e:
        case 0x3f:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x7b:
        case 0x7c:
        case 0x7d:
          local_20 = start;
          break;
        default:
          _len->error = 0x5aa;
          xmlRegexpErrCompile(_len,"Invalid escape value");
          return;
        case 0x6e:
          local_20 = 10;
          break;
        case 0x72:
          local_20 = 0xd;
          break;
        case 0x74:
          local_20 = 9;
        }
        end = 1;
      }
      else {
        if (((start == 0) || (start == 0x5b)) || (start == 0x5d)) {
          _len->error = 0x5aa;
          xmlRegexpErrCompile(_len,"Expecting the end of a char range");
          return;
        }
        end = 4;
        local_20 = xmlGetUTF8Char(_len->cur,&end);
        if ((int)local_20 < 0) {
          _len->error = 0x5aa;
          xmlRegexpErrCompile(_len,"Invalid UTF-8");
          return;
        }
      }
      if ((int)local_20 < (int)local_1c) {
        _len->error = 0x5aa;
        xmlRegexpErrCompile(_len,"End of range is before start of range");
      }
      else {
        _len->cur = _len->cur + end;
        xmlRegAtomAddRange(_len,_len->atom,_len->neg,XML_REGEXP_CHARVAL,local_1c,local_20,
                           (xmlChar *)0x0);
      }
    }
    else {
      xmlRegAtomAddRange(_len,_len->atom,_len->neg,XML_REGEXP_CHARVAL,local_1c,local_1c,
                         (xmlChar *)0x0);
    }
  }
  return;
}

Assistant:

static void
xmlFAParseCharRange(xmlRegParserCtxtPtr ctxt) {
    int cur, len;
    int start = -1;
    int end = -1;

    if (CUR == '\0') {
        ERROR("Expecting ']'");
	return;
    }

    cur = CUR;
    if (cur == '\\') {
	NEXT;
	cur = CUR;
	switch (cur) {
	    case 'n': start = 0xA; break;
	    case 'r': start = 0xD; break;
	    case 't': start = 0x9; break;
	    case '\\': case '|': case '.': case '-': case '^': case '?':
	    case '*': case '+': case '{': case '}': case '(': case ')':
	    case '[': case ']':
		start = cur; break;
	    default:
		ERROR("Invalid escape value");
		return;
	}
	end = start;
        len = 1;
    } else if ((cur != 0x5B) && (cur != 0x5D)) {
        len = 4;
        end = start = xmlGetUTF8Char(ctxt->cur, &len);
        if (start < 0) {
            ERROR("Invalid UTF-8");
            return;
        }
    } else {
	ERROR("Expecting a char range");
	return;
    }
    /*
     * Since we are "inside" a range, we can assume ctxt->cur is past
     * the start of ctxt->string, and PREV should be safe
     */
    if ((start == '-') && (NXT(1) != ']') && (PREV != '[') && (PREV != '^')) {
	NEXTL(len);
	return;
    }
    NEXTL(len);
    cur = CUR;
    if ((cur != '-') || (NXT(1) == '[') || (NXT(1) == ']')) {
        xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
		              XML_REGEXP_CHARVAL, start, end, NULL);
	return;
    }
    NEXT;
    cur = CUR;
    if (cur == '\\') {
	NEXT;
	cur = CUR;
	switch (cur) {
	    case 'n': end = 0xA; break;
	    case 'r': end = 0xD; break;
	    case 't': end = 0x9; break;
	    case '\\': case '|': case '.': case '-': case '^': case '?':
	    case '*': case '+': case '{': case '}': case '(': case ')':
	    case '[': case ']':
		end = cur; break;
	    default:
		ERROR("Invalid escape value");
		return;
	}
        len = 1;
    } else if ((cur != '\0') && (cur != 0x5B) && (cur != 0x5D)) {
        len = 4;
        end = xmlGetUTF8Char(ctxt->cur, &len);
        if (end < 0) {
            ERROR("Invalid UTF-8");
            return;
        }
    } else {
	ERROR("Expecting the end of a char range");
	return;
    }

    /* TODO check that the values are acceptable character ranges for XML */
    if (end < start) {
	ERROR("End of range is before start of range");
    } else {
        NEXTL(len);
        xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
		           XML_REGEXP_CHARVAL, start, end, NULL);
    }
}